

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_create_array(JSContext *ctx,int len,JSValue *tab)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  int iVar3;
  ulong uVar5;
  int64_t *piVar6;
  JSRefCountHeader *p;
  ulong uVar7;
  JSValue JVar8;
  JSValue val;
  int64_t iVar4;
  
  JVar8 = JS_NewArray(ctx);
  iVar4 = JVar8.tag;
  uVar7 = 0;
  if ((int)JVar8.tag != 6) {
    uVar5 = (ulong)(uint)len;
    if (len < 1) {
      uVar5 = uVar7;
    }
    piVar6 = &tab->tag;
    do {
      if (uVar5 == uVar7) {
        uVar7 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
        uVar5 = (ulong)JVar8.u.ptr & 0xffffffff;
        goto LAB_00133af4;
      }
      JVar1 = (JSValueUnion)((JSValueUnion *)(piVar6 + -1))->ptr;
      iVar2 = *piVar6;
      if (0xfffffff4 < (uint)iVar2) {
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
      }
      val.tag = iVar2;
      val.u.ptr = JVar1.ptr;
      iVar3 = JS_CreateDataPropertyUint32(ctx,JVar8,uVar7,val,0);
      uVar7 = uVar7 + 1;
      piVar6 = piVar6 + 2;
    } while (-1 < iVar3);
    JS_FreeValue(ctx,JVar8);
  }
  uVar5 = 0;
  uVar7 = 0;
  iVar4 = 6;
LAB_00133af4:
  JVar8.tag = iVar4;
  JVar8.u.ptr = (void *)(uVar5 | uVar7);
  return JVar8;
}

Assistant:

static JSValue js_create_array(JSContext *ctx, int len, JSValueConst *tab)
{
    JSValue obj;
    int i;

    obj = JS_NewArray(ctx);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    for(i = 0; i < len; i++) {
        if (JS_CreateDataPropertyUint32(ctx, obj, i, JS_DupValue(ctx, tab[i]), 0) < 0) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    }
    return obj;
}